

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ossl_bio_cf_out_write(BIO *bio,char *buf,int blen)

{
  curl_trc_feat *pcVar1;
  Curl_cfilter *cf;
  ulong uVar2;
  Curl_easy *data;
  CURLcode result;
  CURLcode local_3c;
  long local_38;
  
  cf = (Curl_cfilter *)BIO_get_data();
  uVar2 = 0;
  if (cf == (Curl_cfilter *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)((long)cf->ctx + 0x38);
  }
  local_38 = *(long *)((long)cf->ctx + 0x30);
  local_3c = CURLE_SEND_ERROR;
  if (blen < 0) goto LAB_0016e99e;
  uVar2 = Curl_conn_cf_send(cf->next,data,buf,(ulong)(uint)blen,false,&local_3c);
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar1 = (data->state).feat;
    if (pcVar1 == (curl_trc_feat *)0x0) {
      if (cf != (Curl_cfilter *)0x0) goto LAB_0016e93f;
    }
    else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar1->log_level)) {
LAB_0016e93f:
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"ossl_bio_cf_out_write(len=%d) -> %d, err=%d",(ulong)(uint)blen,
                          uVar2 & 0xffffffff,(ulong)local_3c);
      }
    }
  }
  BIO_clear_flags((BIO *)bio,0xf);
  *(CURLcode *)(local_38 + 0x20) = local_3c;
  if (local_3c == CURLE_AGAIN && (long)uVar2 < 0) {
    BIO_set_flags((BIO *)bio,10);
  }
LAB_0016e99e:
  return (int)uVar2;
}

Assistant:

static int ossl_bio_cf_out_write(BIO *bio, const char *buf, int blen)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nwritten;
  CURLcode result = CURLE_SEND_ERROR;

  DEBUGASSERT(data);
  if(blen < 0)
    return 0;

  nwritten = Curl_conn_cf_send(cf->next, data, buf, (size_t)blen, FALSE,
                               &result);
  CURL_TRC_CF(data, cf, "ossl_bio_cf_out_write(len=%d) -> %d, err=%d",
              blen, (int)nwritten, result);
  BIO_clear_retry_flags(bio);
  octx->io_result = result;
  if(nwritten < 0) {
    if(CURLE_AGAIN == result)
      BIO_set_retry_write(bio);
  }
  return (int)nwritten;
}